

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

RotationY<float> * __thiscall
qclab::qgates::RotationY<float>::operator*=(RotationY<float> *this,RotationY<float> *rhs)

{
  int iVar1;
  int iVar2;
  rotation_type *rhs_00;
  RotationY<float> *rhs_local;
  RotationY<float> *this_local;
  
  iVar1 = (*(this->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
            _vptr_QObject[3])();
  iVar2 = (*(rhs->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
            _vptr_QObject[3])();
  if (iVar1 == iVar2) {
    rhs_00 = QRotationGate1<float>::rotation(&rhs->super_QRotationGate1<float>);
    QRotation<float>::operator*=(&(this->super_QRotationGate1<float>).rotation_,rhs_00);
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/RotationY.hpp"
                ,0xa2,
                "RotationY<T> &qclab::qgates::RotationY<float>::operator*=(const RotationY<T> &) [T = float]"
               );
}

Assistant:

inline RotationY< T >& operator*=( const RotationY< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ *= rhs.rotation() ;
          return *this ;
        }